

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_seq_executor.cpp
# Opt level: O1

void __thiscall KeySequentialExecutor::startWorkers(KeySequentialExecutor *this)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint __len;
  string __str;
  __hashtable *__h;
  undefined1 local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  shared_ptr<Worker> local_50;
  _Hashtable<int,std::pair<int_const,unsigned_long>,std::allocator<std::pair<int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_40;
  vector<std::shared_ptr<Worker>,std::allocator<std::shared_ptr<Worker>>> *local_38;
  
  if (this->m_numThreads != 0) {
    local_38 = (vector<std::shared_ptr<Worker>,std::allocator<std::shared_ptr<Worker>>> *)
               &this->m_workers;
    local_40 = (_Hashtable<int,std::pair<int_const,unsigned_long>,std::allocator<std::pair<int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->m_stats;
    uVar4 = 0;
    do {
      __len = 1;
      if (9 < uVar4) {
        uVar1 = 4;
        uVar3 = uVar4;
        do {
          __len = uVar1;
          uVar2 = (uint)uVar3;
          if (uVar2 < 100) {
            __len = __len - 2;
            goto LAB_001211e8;
          }
          if (uVar2 < 1000) {
            __len = __len - 1;
            goto LAB_001211e8;
          }
          if (uVar2 < 10000) goto LAB_001211e8;
          uVar3 = (uVar3 & 0xffffffff) / 10000;
          uVar1 = __len + 4;
        } while (99999 < uVar2);
        __len = __len + 1;
      }
LAB_001211e8:
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_70,(ulong)__len,'-');
      std::__detail::__to_chars_10_impl<unsigned_int>(local_70._M_dataplus._M_p,__len,(uint)uVar4);
      local_50.super___shared_ptr<Worker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Worker,std::allocator<Worker>,std::__cxx11::string>
                (&local_50.super___shared_ptr<Worker,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (Worker **)&local_50,(allocator<Worker> *)&local_71,&local_70);
      std::vector<std::shared_ptr<Worker>,std::allocator<std::shared_ptr<Worker>>>::
      emplace_back<std::shared_ptr<Worker>>(local_38,&local_50);
      if (local_50.super___shared_ptr<Worker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.super___shared_ptr<Worker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      local_70._M_dataplus._M_p._0_4_ = (uint)uVar4;
      local_70._M_string_length = 0;
      std::
      _Hashtable<int,std::pair<int_const,unsigned_long>,std::allocator<std::pair<int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<int_const,unsigned_long>>(local_40,&local_70);
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->m_numThreads);
  }
  return;
}

Assistant:

void KeySequentialExecutor::startWorkers()
{
    //std::cout << "Going to start workers : " << m_numThreads << std::endl;
    for(int i = 0; i < m_numThreads; ++i)
    {
        m_workers.push_back(std::make_shared<Worker>(std::to_string(i)));
        m_stats.insert({i, 0});
    }
}